

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  pointer ppNVar1;
  pointer __s1;
  pointer piVar2;
  bool bVar3;
  int iVar4;
  undefined8 extraout_RAX;
  long *plVar5;
  size_t __n;
  int iVar6;
  pointer ppNVar7;
  initializer_list<int> __l;
  _Deque_base<Node_*,_std::allocator<Node_*>_> local_250;
  _Deque_base<Node_*,_std::allocator<Node_*>_> local_200;
  undefined1 local_1b0 [8];
  Node init;
  queue<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_> closedList;
  vector<int,_std::allocator<int>_> local_120;
  vector<Node_*,_std::allocator<Node_*>_> local_108;
  undefined1 local_f0 [8];
  vector<int,_std::allocator<int>_> goalState;
  vector<Node_*,_std::allocator<Node_*>_> solution;
  undefined1 auStack_b8 [8];
  queue<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_> openList;
  Node *local_60;
  Node *currentChild;
  Node *currentNode;
  undefined1 auStack_48 [8];
  vector<int,_std::allocator<int>_> initial;
  
  auStack_48 = (undefined1  [8])0x0;
  initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  auStack_b8._0_4_ = 1;
  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
            ((vector<int,_std::allocator<int>_> *)auStack_48,(iterator)0x0,(int *)auStack_b8);
  auStack_b8._0_4_ = 2;
  if (initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      == initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              ((vector<int,_std::allocator<int>_> *)auStack_48,
               (iterator)
               initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_start,(int *)auStack_b8);
  }
  else {
    *initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = 2;
    initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start + 1;
  }
  auStack_b8._0_4_ = 3;
  if (initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      == initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              ((vector<int,_std::allocator<int>_> *)auStack_48,
               (iterator)
               initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_start,(int *)auStack_b8);
  }
  else {
    *initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = 3;
    initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start + 1;
  }
  auStack_b8._0_4_ = 4;
  if (initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      == initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              ((vector<int,_std::allocator<int>_> *)auStack_48,
               (iterator)
               initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_start,(int *)auStack_b8);
  }
  else {
    *initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = 4;
    initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start + 1;
  }
  auStack_b8._0_4_ = 0;
  if (initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      == initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              ((vector<int,_std::allocator<int>_> *)auStack_48,
               (iterator)
               initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_start,(int *)auStack_b8);
  }
  else {
    *initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = 0;
    initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start + 1;
  }
  auStack_b8._0_4_ = 5;
  if (initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      == initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              ((vector<int,_std::allocator<int>_> *)auStack_48,
               (iterator)
               initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_start,(int *)auStack_b8);
  }
  else {
    *initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = 5;
    initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start + 1;
  }
  auStack_b8._0_4_ = 6;
  if (initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      == initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              ((vector<int,_std::allocator<int>_> *)auStack_48,
               (iterator)
               initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_start,(int *)auStack_b8);
  }
  else {
    *initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = 6;
    initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start + 1;
  }
  auStack_b8._0_4_ = 7;
  if (initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      == initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              ((vector<int,_std::allocator<int>_> *)auStack_48,
               (iterator)
               initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_start,(int *)auStack_b8);
  }
  else {
    *initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = 7;
    initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start + 1;
  }
  auStack_b8._0_4_ = 8;
  if (initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      == initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              ((vector<int,_std::allocator<int>_> *)auStack_48,
               (iterator)
               initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_start,(int *)auStack_b8);
  }
  else {
    *initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = 8;
    initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start + 1;
  }
  openList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Deque_impl_data.
  _M_map_size = 0x600000005;
  openList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Deque_impl_data.
  _M_start._M_cur = (_Elt_pointer)0x800000007;
  auStack_b8 = (undefined1  [8])0x200000001;
  openList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Deque_impl_data.
  _M_map = (_Map_pointer)0x400000003;
  openList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Deque_impl_data.
  _M_start._M_first =
       (_Elt_pointer)
       ((ulong)openList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.
               super__Deque_impl_data._M_start._M_first._4_4_ << 0x20);
  __l._M_len = 9;
  __l._M_array = (iterator)auStack_b8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_f0,__l,(allocator_type *)&init.parent);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_120,(vector<int,_std::allocator<int>_> *)auStack_48);
  Node::Node((Node *)local_1b0,&local_120,(Node *)0x0);
  if (local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  openList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_first = (_Elt_pointer)0x0;
  openList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_last = (_Elt_pointer)0x0;
  openList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Deque_impl_data.
  _M_start._M_node = (_Map_pointer)0x0;
  openList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_cur = (_Elt_pointer)0x0;
  openList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Deque_impl_data.
  _M_start._M_first = (_Elt_pointer)0x0;
  openList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Deque_impl_data.
  _M_start._M_last = (_Elt_pointer)0x0;
  openList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Deque_impl_data.
  _M_map_size = 0;
  openList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Deque_impl_data.
  _M_start._M_cur = (_Elt_pointer)0x0;
  auStack_b8 = (undefined1  [8])0x0;
  openList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Deque_impl_data.
  _M_map = (_Map_pointer)0x0;
  std::_Deque_base<Node_*,_std::allocator<Node_*>_>::_M_initialize_map
            ((_Deque_base<Node_*,_std::allocator<Node_*>_> *)auStack_b8,0);
  closedList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Deque_impl_data.
  _M_start._M_node = (_Map_pointer)0x0;
  init.parent = (Node *)0x0;
  std::_Deque_base<Node_*,_std::allocator<Node_*>_>::_M_initialize_map
            ((_Deque_base<Node_*,_std::allocator<Node_*>_> *)&init.parent,0);
  if ((_Elt_pointer)
      openList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Deque_impl_data.
      _M_start._M_node ==
      openList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Deque_impl_data.
      _M_finish._M_first + -1) {
    goalState.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)local_1b0;
    std::deque<Node*,std::allocator<Node*>>::_M_push_back_aux<Node*>
              ((deque<Node*,std::allocator<Node*>> *)auStack_b8,
               (Node **)&goalState.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
  }
  else {
    *openList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Deque_impl_data.
     _M_start._M_node = (Node **)local_1b0;
    openList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Deque_impl_data.
    _M_start._M_node =
         openList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.
         super__Deque_impl_data._M_start._M_node + 1;
  }
  goalState.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Searching for solution...",0x19);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  if (openList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Deque_impl_data.
      _M_start._M_node ==
      (_Map_pointer)
      openList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Deque_impl_data.
      _M_map_size) {
    iVar6 = 0;
  }
  else {
    iVar6 = 0;
    do {
      currentChild = *(Node **)openList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl
                               .super__Deque_impl_data._M_map_size;
      if (closedList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Deque_impl_data._M_start._M_node == (_Map_pointer)0xfffffffffffffff8) {
        std::deque<Node*,std::allocator<Node*>>::_M_push_back_aux<Node*const&>
                  ((deque<Node*,std::allocator<Node*>> *)&init.parent,&currentChild);
      }
      else {
        *closedList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.
         super__Deque_impl_data._M_start._M_node = (Node **)currentChild;
        closedList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Deque_impl_data._M_start._M_node =
             closedList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.
             super__Deque_impl_data._M_start._M_node + 1;
      }
      if ((_Elt_pointer)
          openList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Deque_impl_data._M_map_size ==
          openList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Deque_impl_data._M_start._M_first + -1) {
        operator_delete(openList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                        super__Deque_impl_data._M_start._M_cur,0x200);
        openList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Deque_impl_data
        ._M_map_size = (size_t)openList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl
                               .super__Deque_impl_data._M_start._M_last[1];
        openList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Deque_impl_data
        ._M_start._M_first =
             (_Elt_pointer)
             &(((Node *)(openList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                         super__Deque_impl_data._M_map_size + 0x1f8))->children).
              super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
              _M_finish;
        openList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Deque_impl_data
        ._M_start._M_cur =
             (_Elt_pointer)
             openList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.
             super__Deque_impl_data._M_map_size;
        openList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Deque_impl_data
        ._M_start._M_last =
             openList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.
             super__Deque_impl_data._M_start._M_last + 1;
      }
      else {
        openList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Deque_impl_data
        ._M_map_size = openList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                       super__Deque_impl_data._M_map_size + 8;
      }
      Node::moveUp(currentChild);
      Node::moveDown(currentChild);
      Node::moveRight(currentChild);
      Node::moveLeft(currentChild);
      ppNVar7 = (currentChild->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl
                .super__Vector_impl_data._M_start;
      ppNVar1 = (currentChild->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl
                .super__Vector_impl_data._M_finish;
      if (ppNVar7 == ppNVar1) {
        currentNode._4_4_ = 0;
      }
      else {
        currentNode._4_4_ = 0;
        do {
          local_60 = *ppNVar7;
          __s1 = (local_60->puzzle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
          piVar2 = (local_60->puzzle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          __n = (long)piVar2 - (long)__s1;
          if ((__n == (long)goalState.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start - (long)local_f0) &&
             ((piVar2 == __s1 || (iVar4 = bcmp(__s1,(void *)local_f0,__n), iVar4 == 0)))) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Goal Found.",0xb);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
            std::ostream::put(-0x70);
            std::ostream::flush();
            std::vector<Node_*,_std::allocator<Node_*>_>::vector
                      (&local_108,
                       (vector<Node_*,_std::allocator<Node_*>_> *)
                       &goalState.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
            traceSolution(&local_108,local_60);
            currentNode._4_4_ = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
            if (local_108.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_108.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_108.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_108.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
          }
          std::deque<Node_*,_std::allocator<Node_*>_>::deque
                    ((deque<Node_*,_std::allocator<Node_*>_> *)&local_200,
                     (deque<Node_*,_std::allocator<Node_*>_> *)auStack_b8);
          bVar3 = contains((queue<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_> *)&local_200
                           ,local_60);
          if (bVar3) {
            std::_Deque_base<Node_*,_std::allocator<Node_*>_>::~_Deque_base(&local_200);
          }
          else {
            std::deque<Node_*,_std::allocator<Node_*>_>::deque
                      ((deque<Node_*,_std::allocator<Node_*>_> *)&local_250,
                       (deque<Node_*,_std::allocator<Node_*>_> *)&init.parent);
            bVar3 = contains((queue<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_> *)
                             &local_250,local_60);
            std::_Deque_base<Node_*,_std::allocator<Node_*>_>::~_Deque_base(&local_250);
            std::_Deque_base<Node_*,_std::allocator<Node_*>_>::~_Deque_base(&local_200);
            if (!bVar3) {
              if ((_Elt_pointer)
                  openList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Deque_impl_data._M_start._M_node ==
                  openList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first + -1) {
                std::deque<Node*,std::allocator<Node*>>::_M_push_back_aux<Node*const&>
                          ((deque<Node*,std::allocator<Node*>> *)auStack_b8,&local_60);
              }
              else {
                *openList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Deque_impl_data._M_start._M_node = (Node **)local_60;
                openList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Deque_impl_data._M_start._M_node =
                     openList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                     super__Deque_impl_data._M_start._M_node + 1;
              }
            }
          }
          ppNVar7 = ppNVar7 + 1;
        } while (ppNVar7 != ppNVar1);
      }
      iVar6 = iVar6 + 1;
    } while ((openList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Deque_impl_data._M_start._M_node !=
              (_Map_pointer)
              openList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Deque_impl_data._M_map_size) && ((currentNode._4_4_ & 1) == 0));
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"No. of nodes in closed list: ",0x1d);
  plVar5 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar6);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  if (goalState.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != (pointer)0x0) {
    operator_delete(goalState.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    -(long)goalState.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
  }
  std::_Deque_base<Node_*,_std::allocator<Node_*>_>::~_Deque_base
            ((_Deque_base<Node_*,_std::allocator<Node_*>_> *)&init.parent);
  std::_Deque_base<Node_*,_std::allocator<Node_*>_>::~_Deque_base
            ((_Deque_base<Node_*,_std::allocator<Node_*>_> *)auStack_b8);
  if (init.children.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(init.children.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)init.puzzle.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)init.children.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  }
  if (local_1b0 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1b0,
                    (long)init.children.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)local_1b0);
  }
  if (local_f0 != (undefined1  [8])0x0) {
    operator_delete((void *)local_f0,
                    (long)goalState.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)local_f0);
  }
  if (auStack_48 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_48,
                    (long)initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)auStack_48);
  }
  return 0;
}

Assistant:

int main() {
  std::vector<int> initial;
  initial.push_back(1);
  initial.push_back(2);
  initial.push_back(3);
  initial.push_back(4);
  initial.push_back(0);
  initial.push_back(5);
  initial.push_back(6);
  initial.push_back(7);
  initial.push_back(8);
  vector<int> goalState = { 1, 2, 3, 4, 5, 6, 7, 8, 0 };
  Node init = Node(initial, NULL);
  std::queue<Node*> openList;
  std::queue<Node*> closedList;
  openList.push(&init);
  bool goalFound = false;
  int count = 0;
  vector<Node*> solution;
  cout << "Searching for solution..." << endl;
  while (!openList.empty() && !goalFound) {
    Node* currentNode = openList.front();
    closedList.push(currentNode);
    openList.pop();
    currentNode->moveUp();
    currentNode->moveDown();
    currentNode->moveRight();
    currentNode->moveLeft();

    for (auto i : currentNode->children) {
      Node* currentChild = i;
      if (currentChild->puzzle == goalState) {
        std::cout << "Goal Found." << endl;
        traceSolution(solution, currentChild);
        goalFound = true;

      }
      if (!contains(openList, currentChild)
          && !contains(closedList, currentChild)) {
        openList.push(currentChild);
      }

    }
    count++;
  }
  cout << "No. of nodes in closed list: " << count << endl;
//  printToFile(closedList);  // uncomment this line to print node in text file
}